

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O2

void __thiscall
Covariance::Covariance4D<Vector,_double>::SpatialFilter
          (Covariance4D<Vector,_double> *this,double *sxx,double *sxy,double *syy)

{
  bool bVar1;
  undefined4 *puVar2;
  double dVar3;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double local_38;
  double dStack_30;
  double local_28;
  double local_20;
  
  local_98 = (this->matrix)._M_elems[0] + 1e-05;
  local_90 = (this->matrix)._M_elems[1];
  local_70 = (this->matrix)._M_elems[2] + 1e-05;
  local_88 = (this->matrix)._M_elems[3];
  local_68 = (this->matrix)._M_elems[4];
  local_48 = (this->matrix)._M_elems[5] + 1e-05;
  local_80 = (this->matrix)._M_elems[6];
  local_60 = (this->matrix)._M_elems[7];
  local_40 = (this->matrix)._M_elems[8];
  local_20 = (this->matrix)._M_elems[9] + 1e-05;
  local_78 = local_90;
  local_58 = local_88;
  dStack_50 = local_68;
  local_38 = local_80;
  dStack_30 = local_60;
  local_28 = local_40;
  bVar1 = Inverse<double>(&local_98,4);
  if (bVar1) {
    dVar3 = (local_98 * local_70 - local_90 * local_90) / 39.47841760435743;
    *sxx = local_70 / dVar3;
    *syy = local_98 / dVar3;
    *sxy = -local_90 / dVar3;
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 1;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

void SpatialFilter(Float& sxx, Float& sxy, Float& syy) const {

         // Compute the inverse matrix. We need to add an epsilon to the
         // diagonal in order to ensure that the matrix can be inverted.
         Float inverse[16];
         inverse[ 0] = matrix[ 0] + COV_MIN_FLOAT;
         inverse[ 1] = matrix[ 1]; inverse[ 4] = matrix[ 1];
         inverse[ 5] = matrix[ 2] + COV_MIN_FLOAT;
         inverse[ 2] = matrix[ 3]; inverse[ 8] = matrix[ 3];
         inverse[ 6] = matrix[ 4]; inverse[ 9] = matrix[ 4];
         inverse[10] = matrix[ 5] + COV_MIN_FLOAT;
         inverse[ 3] = matrix[ 6]; inverse[12] = matrix[ 6];
         inverse[ 7] = matrix[ 7]; inverse[13] = matrix[ 7];
         inverse[11] = matrix[ 8]; inverse[14] = matrix[ 8];
         inverse[15] = matrix[ 9] + COV_MIN_FLOAT;

         if(!Inverse<Float>(inverse, 4)) { throw 1; }

         // The outgoing filter is the inverse submatrix of this inverse
         // matrix.
         Float det = (inverse[0]*inverse[5]-inverse[1]*inverse[1]) / pow(2.0*M_PI, 2);
         sxx =  inverse[5] / det;
         syy =  inverse[0] / det;
         sxy = -inverse[1] / det;
      }